

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strbuf.c
# Opt level: O0

strbuf * strbuf_new_general(_Bool nm)

{
  size_t *psVar1;
  void *pvVar2;
  strbuf_impl *buf;
  _Bool nm_local;
  
  psVar1 = (size_t *)safemalloc(1,0x40,0);
  psVar1[4] = (size_t)strbuf_BinarySink_write;
  psVar1[5] = 0;
  psVar1[6] = (size_t)(psVar1 + 4);
  psVar1[5] = (size_t)strbuf_BinarySink_writefmtv;
  psVar1[3] = 0;
  *psVar1 = 0x200;
  *(_Bool *)(psVar1 + 7) = nm;
  pvVar2 = safemalloc(*psVar1,1,0);
  psVar1[1] = (size_t)pvVar2;
  psVar1[2] = psVar1[1];
  *(undefined1 *)psVar1[1] = 0;
  return (strbuf *)(psVar1 + 1);
}

Assistant:

static strbuf *strbuf_new_general(bool nm)
{
    struct strbuf_impl *buf = snew(struct strbuf_impl);
    BinarySink_INIT(&buf->visible, strbuf_BinarySink_write);
    buf->visible.binarysink_->writefmtv = strbuf_BinarySink_writefmtv;
    buf->visible.len = 0;
    buf->size = 512;
    buf->nm = nm;
    STRBUF_SET_PTR(buf, snewn(buf->size, char));
    *buf->visible.s = '\0';
    return &buf->visible;
}